

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O3

wchar_t file_close(archive_conflict *a,void *client_data)

{
  wchar_t wVar1;
  
  if (client_data == (void *)0x0) {
    wVar1 = L'\xffffffe2';
  }
  else {
    wVar1 = L'\0';
    if (-1 < *client_data) {
      close(*client_data);
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */

	if (mine == NULL)
		return (ARCHIVE_FATAL);

	if (mine->fd >= 0)
		close(mine->fd);

	return (ARCHIVE_OK);
}